

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_loader_impl.c
# Opt level: O0

loader_impl_data mock_loader_impl_initialize(loader_impl impl,configuration config)

{
  int iVar1;
  undefined8 *__ptr;
  undefined8 in_RDI;
  loader_impl_mock mock_impl;
  loader_impl in_stack_fffffffffffffff8;
  
  __ptr = (undefined8 *)malloc(8);
  if (__ptr == (undefined8 *)0x0) {
    __ptr = (undefined8 *)0x0;
  }
  else {
    iVar1 = mock_loader_impl_initialize_types(in_stack_fffffffffffffff8);
    if (iVar1 == 0) {
      *__ptr = 0;
      loader_initialization_register(in_RDI);
    }
    else {
      free(__ptr);
      __ptr = (undefined8 *)0x0;
    }
  }
  return __ptr;
}

Assistant:

loader_impl_data mock_loader_impl_initialize(loader_impl impl, configuration config)
{
	loader_impl_mock mock_impl;

	(void)impl;
	(void)config;

	mock_impl = malloc(sizeof(struct loader_impl_mock_type));

	if (mock_impl == NULL)
	{
		return NULL;
	}

	if (mock_loader_impl_initialize_types(impl) != 0)
	{
		free(mock_impl);

		return NULL;
	}

	mock_impl->impl_mock_data = NULL;

	/* Register initialization */
	loader_initialization_register(impl);

	return mock_impl;
}